

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BplusTree.hpp
# Opt level: O0

bool __thiscall
sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::erase
          (BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *this,
          unsigned_long_long *key)

{
  DynamicFileManager<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
  *pDVar1;
  _func_int *p_Var2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  long lVar6;
  long lVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long *plVar12;
  node **ppnVar13;
  long alStackY_110 [2];
  unsigned_long_long in_stack_ffffffffffffff00;
  unsigned_long_long in_stack_ffffffffffffff08;
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>
  *in_stack_ffffffffffffff10;
  locType in_stack_ffffffffffffff18;
  DynamicFileManager<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
  *in_stack_ffffffffffffff20;
  bool local_8b;
  byte local_8a;
  bool local_89;
  unsigned_long_long old;
  unsigned_long __vla_expr1;
  unsigned_long __vla_expr0;
  int local_5c;
  int newsz;
  node **y;
  node **x;
  int *local_40;
  int *pp;
  node **p;
  locType *pos;
  int j;
  int i;
  unsigned_long_long *key_local;
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *this_local;
  
  if (this->depth == 0) {
    this_local._7_1_ = false;
  }
  else {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (long)(this->depth + 1);
    uVar11 = SUB168(auVar3 * ZEXT816(8),0);
    if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
      uVar11 = 0xffffffffffffffff;
    }
    alStackY_110[0] = 0x110c35;
    _j = key;
    key_local = (unsigned_long_long *)this;
    p = (node **)operator_new__(uVar11);
    alStackY_110[0] = 0x110c49;
    memset(p,0,8);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (long)(this->depth + 1);
    uVar11 = SUB168(auVar4 * ZEXT816(8),0);
    if (SUB168(auVar4 * ZEXT816(8),8) != 0) {
      uVar11 = 0xffffffffffffffff;
    }
    alStackY_110[0] = 0x110c75;
    pp = (int *)operator_new__(uVar11);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (long)(this->depth + 1);
    uVar11 = SUB168(auVar5 * ZEXT816(4),0);
    if (SUB168(auVar5 * ZEXT816(4),8) != 0) {
      uVar11 = 0xffffffffffffffff;
    }
    alStackY_110[0] = 0x110ca8;
    local_40 = (int *)operator_new__(uVar11);
    *p = (node *)this->root;
    for (pos._4_4_ = 0; pos._4_4_ < this->depth; pos._4_4_ = pos._4_4_ + 1) {
      alStackY_110[0] = 0x110cf1;
      iVar9 = (*(this->file->
                super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
                )._vptr_FileManager_Base[2])(this->file,p + pos._4_4_);
      *(ulong *)(pp + (long)pos._4_4_ * 2) = CONCAT44(extraout_var,iVar9);
      pos._0_4_ = 0;
      while( true ) {
        local_89 = false;
        if ((int)pos < *(int *)(*(long *)(pp + (long)pos._4_4_ * 2) + 0x640)) {
          alStackY_110[0] = 0x110d51;
          local_89 = std::less<unsigned_long_long>::operator()
                               ((less<unsigned_long_long> *)((long)&x + 7),
                                (unsigned_long_long *)
                                (*(long *)(pp + (long)pos._4_4_ * 2) + 0x328 + (long)(int)pos * 8),
                                _j);
        }
        if (local_89 == false) break;
        pos._0_4_ = (int)pos + 1;
      }
      if (pos._4_4_ < this->depth + -1) {
        local_8a = 0;
        if ((int)pos < *(int *)(*(long *)(pp + (long)pos._4_4_ * 2) + 0x640)) {
          alStackY_110[0] = 0x110dce;
          bVar8 = std::less<unsigned_long_long>::operator()
                            ((less<unsigned_long_long> *)((long)&x + 6),_j,
                             (unsigned_long_long *)
                             (*(long *)(pp + (long)pos._4_4_ * 2) + 0x328 + (long)(int)pos * 8));
          local_8a = bVar8 ^ 0xff;
        }
        if ((local_8a & 1) != 0) {
          pos._0_4_ = (int)pos + 1;
        }
        p[pos._4_4_ + 1] = *(node **)(*(long *)(pp + (long)pos._4_4_ * 2) + (long)(int)pos * 8);
      }
      local_40[pos._4_4_] = (int)pos;
    }
    local_8b = true;
    if ((int)pos != *(int *)(*(long *)(pp + (long)(this->depth + -1) * 2) + 0x640)) {
      alStackY_110[0] = 0x110e86;
      local_8b = std::less<unsigned_long_long>::operator()
                           ((less<unsigned_long_long> *)((long)&x + 5),_j,
                            (unsigned_long_long *)
                            (*(long *)(pp + (long)(this->depth + -1) * 2) + 0x328 +
                            (long)(int)pos * 8));
    }
    if (local_8b == false) {
      y = (node **)(pp + (long)(this->depth + -1) * 2);
      iVar9 = (int)pos;
      if ((int)pos == 0) {
        for (pos._4_4_ = this->depth + -2; iVar9 = (int)pos, -1 < pos._4_4_;
            pos._4_4_ = pos._4_4_ + -1) {
          if (local_40[pos._4_4_] != 0) {
            alStackY_110[0] = 0x110f81;
            bVar8 = equal(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                          in_stack_ffffffffffffff00);
            if (bVar8) {
              *(unsigned_long_long *)
               (*(long *)(pp + (long)pos._4_4_ * 2) + 0x328 + (long)(local_40[pos._4_4_] + -1) * 8)
                   = (*y)->keyvalue[1];
              alStackY_110[0] = 0x110fd7;
              (*(this->file->
                super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
                )._vptr_FileManager_Base[3])(this->file,p + pos._4_4_);
              iVar9 = (int)pos;
              break;
            }
          }
        }
      }
      while (pos._4_4_ = iVar9 + 1, pos._4_4_ < (*y)->sz) {
        (*y)->keyvalue[iVar9] = (*y)->keyvalue[pos._4_4_];
        ((*y)->field_0).val[iVar9] = ((*y)->field_0).val[pos._4_4_];
        iVar9 = pos._4_4_;
      }
      (*y)->sz = (*y)->sz + -1;
      if (this->depth == 1) {
        if ((*y)->sz == 0) {
          this->depth = 0;
          alStackY_110[0] = 0x1110a9;
          DynamicFileManager<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
          ::release(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
          this->root = -1;
        }
        else {
          alStackY_110[0] = 0x1110c9;
          (*(this->file->
            super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
            )._vptr_FileManager_Base[3])(this->file,&this->root);
        }
        if (pp != (int *)0x0) {
          alStackY_110[0] = 0x1110e6;
          operator_delete__(pp);
        }
        if (local_40 != (int *)0x0) {
          alStackY_110[0] = 0x111103;
          operator_delete__(local_40);
        }
        if (p != (node **)0x0) {
          alStackY_110[0] = 0x111120;
          operator_delete__(p);
        }
        this->siz = this->siz + -1;
        this_local._7_1_ = true;
      }
      else if ((*y)->sz < 0x32) {
        if (local_40[this->depth + -2] ==
            *(int *)(*(long *)(pp + (long)(this->depth + -2) * 2) + 0x640)) {
          *(undefined8 *)(pp + (long)this->depth * 2) =
               *(undefined8 *)(pp + (long)(this->depth + -1) * 2);
          local_40[this->depth] = local_40[this->depth + -2];
          p[this->depth] = p[this->depth + -1];
          local_40[this->depth + -2] =
               *(int *)(*(long *)(pp + (long)(this->depth + -2) * 2) + 0x640) + -1;
          p[this->depth + -1] =
               *(node **)(*(long *)(pp + (long)(this->depth + -2) * 2) +
                         (long)local_40[this->depth + -2] * 8);
          alStackY_110[0] = 0x1112d1;
          iVar9 = (*(this->file->
                    super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
                    )._vptr_FileManager_Base[2])(this->file,p + (this->depth + -1));
          *(ulong *)(pp + (long)(this->depth + -1) * 2) = CONCAT44(extraout_var_00,iVar9);
        }
        else {
          local_40[this->depth] = local_40[this->depth + -2] + 1;
          p[this->depth] =
               *(node **)(*(long *)(pp + (long)(this->depth + -2) * 2) +
                         (long)local_40[this->depth] * 8);
          alStackY_110[0] = 0x11134c;
          iVar9 = (*(this->file->
                    super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
                    )._vptr_FileManager_Base[2])(this->file,p + this->depth);
          *(ulong *)(pp + (long)this->depth * 2) = CONCAT44(extraout_var_01,iVar9);
        }
        plVar12 = (long *)(pp + (long)this->depth * 2);
        _newsz = plVar12;
        if ((*y)->sz + *(int *)(*plVar12 + 0x640) < 100) {
          for (pos._4_4_ = 0; pos._4_4_ < *(int *)(*plVar12 + 0x640); pos._4_4_ = pos._4_4_ + 1) {
            ((*y)->field_0).val[(*y)->sz + pos._4_4_] = *(long *)(*plVar12 + (long)pos._4_4_ * 8);
            (*y)->keyvalue[(*y)->sz + pos._4_4_] =
                 *(unsigned_long_long *)(*plVar12 + 0x328 + (long)pos._4_4_ * 8);
          }
          (*y)->nxt = *(locType *)(*plVar12 + 800);
          (*y)->sz = *(int *)(*plVar12 + 0x640) + (*y)->sz;
          alStackY_110[0] = 0x111479;
          (*(this->file->
            super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
            )._vptr_FileManager_Base[3])(this->file,p + (this->depth + -1));
          alStackY_110[0] = 0x111491;
          DynamicFileManager<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
          ::release(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
          local_5c = this->depth + -2;
          alStackY_110[0] = 0x1114b2;
          erasenonleaf(this,&local_5c,(node **)pp,local_40,(locType *)p);
        }
        else {
          uVar10 = (*y)->sz + *(int *)(*plVar12 + 0x640);
          lVar6 = -0x108 - ((ulong)(uVar10 + 1) * 8 + 0xf & 0xfffffffffffffff0);
          lVar7 = lVar6 - ((ulong)uVar10 * 8 + 0xf & 0xfffffffffffffff0);
          for (pos._4_4_ = 0; pos._4_4_ < (*y)->sz; pos._4_4_ = pos._4_4_ + 1) {
            *(long *)((long)alStackY_110 + (long)pos._4_4_ * 8 + lVar6 + 0x110) =
                 ((*y)->field_0).val[pos._4_4_];
            *(unsigned_long_long *)((long)alStackY_110 + (long)pos._4_4_ * 8 + lVar7 + 0x110) =
                 (*y)->keyvalue[pos._4_4_];
          }
          for (pos._4_4_ = (*y)->sz; pos._4_4_ < (int)uVar10; pos._4_4_ = pos._4_4_ + 1) {
            *(undefined8 *)((long)alStackY_110 + (long)pos._4_4_ * 8 + lVar6 + 0x110) =
                 *(undefined8 *)(*plVar12 + (long)(pos._4_4_ - (*y)->sz) * 8);
            *(undefined8 *)((long)alStackY_110 + (long)pos._4_4_ * 8 + lVar7 + 0x110) =
                 *(undefined8 *)(*plVar12 + 0x328 + (long)(pos._4_4_ - (*y)->sz) * 8);
          }
          (*y)->sz = (int)(uVar10 + 1) >> 1;
          *(uint *)(*plVar12 + 0x640) = uVar10 - (*y)->sz;
          for (pos._4_4_ = 0; pos._4_4_ < (*y)->sz; pos._4_4_ = pos._4_4_ + 1) {
            ((*y)->field_0).val[pos._4_4_] =
                 *(long *)((long)alStackY_110 + (long)pos._4_4_ * 8 + lVar6 + 0x110);
            (*y)->keyvalue[pos._4_4_] =
                 *(unsigned_long_long *)((long)alStackY_110 + (long)pos._4_4_ * 8 + lVar7 + 0x110);
          }
          for (pos._4_4_ = 0; pos._4_4_ < *(int *)(*plVar12 + 0x640); pos._4_4_ = pos._4_4_ + 1) {
            *(undefined8 *)(*plVar12 + (long)pos._4_4_ * 8) =
                 *(undefined8 *)
                  ((long)alStackY_110 + (long)(pos._4_4_ + (*y)->sz) * 8 + lVar6 + 0x110);
            *(undefined8 *)(*plVar12 + 0x328 + (long)pos._4_4_ * 8) =
                 *(undefined8 *)
                  ((long)alStackY_110 + (long)(pos._4_4_ + (*y)->sz) * 8 + lVar7 + 0x110);
          }
          pDVar1 = this->file;
          ppnVar13 = p + (this->depth + -1);
          p_Var2 = (pDVar1->
                   super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
                   )._vptr_FileManager_Base[3];
          *(undefined8 *)((long)alStackY_110 + lVar7 + 0x108) = 0x111754;
          (*p_Var2)(pDVar1,ppnVar13);
          pDVar1 = this->file;
          ppnVar13 = p + this->depth;
          p_Var2 = (pDVar1->
                   super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
                   )._vptr_FileManager_Base[3];
          *(undefined8 *)((long)alStackY_110 + lVar7 + 0x108) = 0x111770;
          (*p_Var2)(pDVar1,ppnVar13);
          for (pos._4_4_ = this->depth + -2; -1 < pos._4_4_; pos._4_4_ = pos._4_4_ + -1) {
            *(undefined8 *)((long)alStackY_110 + lVar7 + 0x108) = 0x1117b3;
            bVar8 = equal(*(BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>
                            **)(&stack0xffffffffffffff10 + lVar7 + 0x108),
                          *(unsigned_long_long *)(&stack0xffffffffffffff08 + lVar7 + 0x108),
                          *(unsigned_long_long *)(&stack0xffffffffffffff00 + lVar7 + 0x108));
            if (bVar8) {
              *(undefined8 *)
               (*(long *)(pp + (long)pos._4_4_ * 2) + 0x328 + (long)local_40[pos._4_4_] * 8) =
                   *(undefined8 *)(*_newsz + 0x328);
              pDVar1 = this->file;
              ppnVar13 = p + pos._4_4_;
              p_Var2 = (pDVar1->
                       super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
                       )._vptr_FileManager_Base[3];
              *(undefined8 *)((long)alStackY_110 + lVar7 + 0x108) = 0x111804;
              (*p_Var2)(pDVar1,ppnVar13);
              break;
            }
          }
        }
        if (pp != (int *)0x0) {
          alStackY_110[0] = 0x11183a;
          operator_delete__(pp);
        }
        if (local_40 != (int *)0x0) {
          alStackY_110[0] = 0x111857;
          operator_delete__(local_40);
        }
        if (p != (node **)0x0) {
          alStackY_110[0] = 0x111874;
          operator_delete__(p);
        }
        this->siz = this->siz + -1;
        this_local._7_1_ = true;
      }
      else {
        alStackY_110[0] = 0x11116a;
        (*(this->file->
          super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
          )._vptr_FileManager_Base[3])(this->file,p + (this->depth + -1));
        if (pp != (int *)0x0) {
          alStackY_110[0] = 0x111187;
          operator_delete__(pp);
        }
        if (local_40 != (int *)0x0) {
          alStackY_110[0] = 0x1111a4;
          operator_delete__(local_40);
        }
        if (p != (node **)0x0) {
          alStackY_110[0] = 0x1111c1;
          operator_delete__(p);
        }
        this->siz = this->siz + -1;
        this_local._7_1_ = true;
      }
    }
    else {
      if (pp != (int *)0x0) {
        alStackY_110[0] = 0x110eb5;
        operator_delete__(pp);
      }
      if (local_40 != (int *)0x0) {
        alStackY_110[0] = 0x110ed2;
        operator_delete__(local_40);
      }
      if (p != (node **)0x0) {
        alStackY_110[0] = 0x110eef;
        operator_delete__(p);
      }
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool erase(const Key &key) {
            if (!depth)return 0;
            int i, j;
            locType *pos;
            node **p;
            int *pp;
            pos = new locType[depth + 1];
            memset(pos, 0, sizeof pos);
            p = new node *[depth + 1];
            pp = new int[depth + 1];
            pos[0] = root;
            for (i = 0; i < depth; ++i) {
                p[i] = file->read(pos[i]);
                for (j = 0; j < p[i]->sz && Compare()(p[i]->keyvalue[j], key); ++j);
                if (i < depth - 1) {
                    if (j < p[i]->sz && !Compare()(key, p[i]->keyvalue[j]))++j;
                    pos[i + 1] = p[i]->pointer[j];
                }
                pp[i] = j;
            }
            if (j == p[depth - 1]->sz || Compare()(key, p[depth - 1]->keyvalue[j])) {
                delete[]p;
                delete[]pp;
                delete[]pos;
                return 0;
            }
            node *&x = p[depth - 1];
            if (!j) {
                for (i = depth - 2; i >= 0; --i)
                    if (pp[i] && equal(x->keyvalue[0], p[i]->keyvalue[pp[i] - 1])) {
                        p[i]->keyvalue[pp[i] - 1] = x->keyvalue[1];
                        file->save(pos[i]);
                        break;
                    }
            }
            //file->release(x->pointer[j]);
            for (i = j + 1; i < x->sz; ++i)x->keyvalue[i - 1] = x->keyvalue[i], x->val[i - 1] = x->val[i];
            --x->sz;
            if (depth == 1) {
                if (!x->sz) {
                    depth = 0;
                    file->release(root);
                    root = -1;
                } else {
                    file->save(root);
                }
                delete[]p;
                delete[]pp;
                delete[]pos;
                --siz;
                return 1;
            }
            if (x->sz >= degree >> 1) {
                file->save(pos[depth - 1]);
                delete[]p;
                delete[]pp;
                delete[]pos;
                --siz;
                return 1;
            }
            if (pp[depth - 2] == p[depth - 2]->sz) {
                p[depth] = p[depth - 1];
                pp[depth] = pp[depth - 2];
                pos[depth] = pos[depth - 1];
                pp[depth - 2] = p[depth - 2]->sz - 1;
                pos[depth - 1] = p[depth - 2]->pointer[pp[depth - 2]];
                p[depth - 1] = file->read(pos[depth - 1]);
            } else {
                pp[depth] = pp[depth - 2] + 1;
                pos[depth] = p[depth - 2]->pointer[pp[depth]];
                p[depth] = file->read(pos[depth]);
            }
            node *&y = p[depth];
            if (x->sz + y->sz < degree) {
                for (i = 0; i < y->sz; ++i)x->val[x->sz + i] = y->val[i], x->keyvalue[x->sz + i] = y->keyvalue[i];
                x->nxt = y->nxt;
                x->sz += y->sz;
                file->save(pos[depth - 1]);
                file->release(pos[depth]);
                erasenonleaf(depth - 2, p, pp, pos);
            } else {
                int newsz = x->sz + y->sz;
                T tmpv[newsz + 1];
                Key tmpk[newsz], old = y->keyvalue[0];
                for (i = 0; i < x->sz; ++i)tmpv[i] = x->val[i], tmpk[i] = x->keyvalue[i];
                for (i = x->sz; i < newsz; ++i)tmpv[i] = y->val[i - x->sz], tmpk[i] = y->keyvalue[i - x->sz];
                x->sz = newsz + 1 >> 1;
                y->sz = newsz - x->sz;
                for (i = 0; i < x->sz; ++i)x->val[i] = tmpv[i], x->keyvalue[i] = tmpk[i];
                for (i = 0; i < y->sz; ++i)y->val[i] = tmpv[i + x->sz], y->keyvalue[i] = tmpk[i + x->sz];
                file->save(pos[depth - 1]);
                file->save(pos[depth]);
                for (i = depth - 2; i >= 0; --i)
                    if (equal(old, p[i]->keyvalue[pp[i]])) {
                        p[i]->keyvalue[pp[i]] = y->keyvalue[0];
                        file->save(pos[i]);
                        break;
                    }
            }
            delete[]p;
            delete[]pp;
            delete[]pos;
            --siz;
            return 1;
        }